

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O3

void double_suite::test_same(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  double *in_stack_ffffffffffffffb8;
  char local_40 [8];
  double local_38;
  
  local_40[0] = '\x01';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_38 = (double)CONCAT44(local_38._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x23,"void double_suite::test_same()",local_40,&local_38);
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = -0x10;
  local_40[7] = '?';
  local_38 = 1.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x24,0x1050d4,local_40,&local_38,in_stack_ffffffffffffffb8,predicate);
  local_40[0] = '\x02';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_38 = (double)CONCAT44(local_38._4_4_,2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x26,"void double_suite::test_same()",local_40,&local_38);
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = -0x10;
  local_40[7] = '?';
  local_38 = 1.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x27,0x1050d4,local_40,&local_38,in_stack_ffffffffffffffb8,predicate_00);
  local_40[0] = '\x03';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_38 = (double)CONCAT44(local_38._4_4_,3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x29,"void double_suite::test_same()",local_40,&local_38);
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = -0x10;
  local_40[7] = '?';
  local_38 = 1.0;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x2a,0x1050d4,local_40,&local_38,in_stack_ffffffffffffffb8,predicate_01);
  local_40[0] = '\x04';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_38 = (double)CONCAT44(local_38._4_4_,4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x2c,"void double_suite::test_same()",local_40,&local_38);
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = -0x10;
  local_40[7] = '?';
  local_38 = 1.0;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x2d,0x1050d4,local_40,&local_38,in_stack_ffffffffffffffb8,predicate_02);
  local_40[0] = '\x05';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_38 = (double)CONCAT44(local_38._4_4_,5);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x2f,"void double_suite::test_same()",local_40,&local_38);
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = -0x10;
  local_40[7] = '?';
  local_38 = 1.0;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x30,0x1050d4,local_40,&local_38,in_stack_ffffffffffffffb8,predicate_03);
  return;
}

Assistant:

void test_same()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 5);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
}